

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib525.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  char *pcVar9;
  timeval tVar10;
  int maxfd;
  int running;
  timeval interval;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  stat file_info;
  int local_268;
  int local_264;
  undefined8 local_260;
  timeval local_258;
  fd_set local_248;
  fd_set local_1c8;
  fd_set local_148;
  stat64 local_c0;
  
  tv_test_start = tutil_tvnow();
  if (libtest_arg2 == (char *)0x0) {
    curl_mfprintf(_stderr,"Usage: lib525 [url] [uploadfile]\n");
    iVar2 = 0x76;
    goto LAB_00102588;
  }
  __stream = fopen64(libtest_arg2,"rb");
  uVar1 = _stderr;
  if (__stream == (FILE *)0x0) {
    piVar8 = __errno_location();
    iVar2 = *piVar8;
    pcVar9 = strerror(iVar2);
    curl_mfprintf(uVar1,"fopen failed with error: %d (%s)\n",iVar2,pcVar9);
    curl_mfprintf(_stderr,"Error opening file: (%s)\n",libtest_arg2);
    iVar2 = 0x75;
    goto LAB_00102588;
  }
  iVar2 = fileno(__stream);
  iVar2 = fstat64(iVar2,&local_c0);
  uVar1 = _stderr;
  if (iVar2 == -1) {
    piVar8 = __errno_location();
    iVar2 = *piVar8;
    pcVar9 = strerror(iVar2);
    curl_mfprintf(uVar1,"fstat() failed with error: %d (%s)\n",iVar2,pcVar9);
    curl_mfprintf(_stderr,"ERROR: cannot open file (%s)\n",libtest_arg2);
    fclose(__stream);
    iVar2 = 0x74;
    goto LAB_00102588;
  }
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                  ,0x4a,iVar2,uVar4);
  }
  if (iVar2 == 0) {
    lVar5 = curl_easy_init();
    iVar2 = 0;
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                    ,0x50);
      iVar2 = 0x7c;
    }
    if (lVar5 == 0) {
      lVar6 = 0;
    }
    else {
      iVar3 = curl_easy_setopt(lVar5,0x2e,1);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar4 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                      ,0x53,iVar3,uVar4);
        iVar2 = iVar3;
      }
      if (iVar2 == 0) {
        iVar3 = curl_easy_setopt(lVar5,0x2712,URL);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar4 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                        ,0x56,iVar3,uVar4);
          iVar2 = iVar3;
        }
        if (iVar2 == 0) {
          iVar3 = curl_easy_setopt(lVar5,0x29,1);
          uVar1 = _stderr;
          iVar2 = 0;
          if (iVar3 != 0) {
            uVar4 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                          ,0x59,iVar3,uVar4);
            iVar2 = iVar3;
          }
          if (iVar2 != 0) goto LAB_001024f2;
          iVar3 = curl_easy_setopt(lVar5,0x2721,"-");
          uVar1 = _stderr;
          iVar2 = 0;
          if (iVar3 != 0) {
            uVar4 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                          ,0x5c,iVar3,uVar4);
            iVar2 = iVar3;
          }
          if (iVar2 == 0) {
            iVar3 = curl_easy_setopt(lVar5,0x2719,__stream);
            uVar1 = _stderr;
            iVar2 = 0;
            if (iVar3 != 0) {
              uVar4 = curl_easy_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                            ,0x5f,iVar3,uVar4);
              iVar2 = iVar3;
            }
            if (iVar2 != 0) goto LAB_001024f2;
            iVar3 = curl_easy_setopt(lVar5,0x75a3,local_c0.st_size);
            uVar1 = _stderr;
            iVar2 = 0;
            if (iVar3 != 0) {
              uVar4 = curl_easy_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                            ,0x6a,iVar3,uVar4);
              iVar2 = iVar3;
            }
            if (iVar2 == 0) {
              lVar6 = curl_multi_init();
              if (lVar6 == 0) {
                curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                              ,0x6c);
                iVar2 = 0x7b;
              }
              else {
                iVar2 = curl_multi_add_handle(lVar6,lVar5);
                uVar1 = _stderr;
                if (iVar2 == 0) {
                  iVar2 = 0;
                }
                else {
                  uVar4 = curl_multi_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                                ,0x6e,iVar2,uVar4);
                }
                if (iVar2 == 0) {
                  iVar2 = 0;
                  do {
                    local_268 = -99;
                    local_258.tv_sec = 1;
                    local_258.tv_usec = 0;
                    iVar3 = curl_multi_perform(lVar6,&local_264);
                    uVar1 = _stderr;
                    if (iVar3 == 0) {
                      if (local_264 < 0) {
                        curl_mfprintf(_stderr,
                                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                                      ,0x78);
                        iVar2 = 0x7a;
                      }
                    }
                    else {
                      uVar4 = curl_multi_strerror(iVar3);
                      curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                                    ,0x78,iVar3,uVar4);
                      iVar2 = iVar3;
                    }
                    iVar3 = 10;
                    if (iVar2 == 0) {
                      tVar10 = tutil_tvnow();
                      lVar7 = tutil_tvdiff(tVar10,tv_test_start);
                      if (lVar7 < 0xea61) {
                        if (local_264 == 0) {
                          iVar2 = 0;
                          iVar3 = 0x2b;
                          goto LAB_00102a33;
                        }
                        local_148.__fds_bits[0xe] = 0;
                        local_148.__fds_bits[0xf] = 0;
                        local_148.__fds_bits[0xc] = 0;
                        local_148.__fds_bits[0xd] = 0;
                        local_148.__fds_bits[10] = 0;
                        local_148.__fds_bits[0xb] = 0;
                        local_148.__fds_bits[8] = 0;
                        local_148.__fds_bits[9] = 0;
                        local_148.__fds_bits[6] = 0;
                        local_148.__fds_bits[7] = 0;
                        local_148.__fds_bits[4] = 0;
                        local_148.__fds_bits[5] = 0;
                        local_148.__fds_bits[2] = 0;
                        local_148.__fds_bits[3] = 0;
                        local_148.__fds_bits[0] = 0;
                        local_148.__fds_bits[1] = 0;
                        local_1c8.__fds_bits[0] = 0;
                        local_1c8.__fds_bits[1] = 0;
                        local_1c8.__fds_bits[2] = 0;
                        local_1c8.__fds_bits[3] = 0;
                        local_1c8.__fds_bits[4] = 0;
                        local_1c8.__fds_bits[5] = 0;
                        local_1c8.__fds_bits[6] = 0;
                        local_1c8.__fds_bits[7] = 0;
                        local_1c8.__fds_bits[8] = 0;
                        local_1c8.__fds_bits[9] = 0;
                        local_1c8.__fds_bits[10] = 0;
                        local_1c8.__fds_bits[0xb] = 0;
                        local_1c8.__fds_bits[0xc] = 0;
                        local_1c8.__fds_bits[0xd] = 0;
                        local_1c8.__fds_bits[0xe] = 0;
                        local_1c8.__fds_bits[0xf] = 0;
                        local_248.__fds_bits[0] = 0;
                        local_248.__fds_bits[1] = 0;
                        local_248.__fds_bits[2] = 0;
                        local_248.__fds_bits[3] = 0;
                        local_248.__fds_bits[4] = 0;
                        local_248.__fds_bits[5] = 0;
                        local_248.__fds_bits[6] = 0;
                        local_248.__fds_bits[7] = 0;
                        local_248.__fds_bits[8] = 0;
                        local_248.__fds_bits[9] = 0;
                        local_248.__fds_bits[10] = 0;
                        local_248.__fds_bits[0xb] = 0;
                        local_248.__fds_bits[0xc] = 0;
                        local_248.__fds_bits[0xd] = 0;
                        local_248.__fds_bits[0xe] = 0;
                        local_248.__fds_bits[0xf] = 0;
                        iVar2 = curl_multi_fdset(lVar6,&local_148,&local_1c8,&local_248,&local_268);
                        uVar1 = _stderr;
                        if (iVar2 == 0) {
                          iVar2 = 0;
                          if (local_268 < -1) {
                            curl_mfprintf(_stderr,
                                          "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                                          ,0x83);
                            iVar2 = 0x7a;
                          }
                        }
                        else {
                          uVar4 = curl_multi_strerror(iVar2);
                          curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                                        ,0x83,iVar2,uVar4);
                        }
                        if (iVar2 == 0) {
                          iVar2 = select_wrapper(local_268 + 1,&local_148,&local_1c8,&local_248,
                                                 &local_258);
                          if (iVar2 == -1) {
                            piVar8 = __errno_location();
                            iVar2 = *piVar8;
                            local_260 = _stderr;
                            pcVar9 = strerror(iVar2);
                            curl_mfprintf(local_260,"%s:%d select() failed, with errno %d (%s)\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                                          ,0x87,iVar2,pcVar9);
                            iVar2 = 0x79;
                          }
                          else {
                            tVar10 = tutil_tvnow();
                            lVar7 = tutil_tvdiff(tVar10,tv_test_start);
                            iVar3 = 0;
                            iVar2 = 0;
                            if (lVar7 < 0xea61) goto LAB_00102a33;
                            curl_mfprintf(_stderr,
                                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                                          ,0x89);
                            iVar2 = 0x7d;
                          }
                        }
                      }
                      else {
                        curl_mfprintf(_stderr,
                                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib525.c"
                                      ,0x7a);
                        iVar2 = 0x7d;
                      }
                      iVar3 = 10;
                    }
LAB_00102a33:
                  } while (iVar3 == 0);
                  if ((iVar3 != 0x2b) && (iVar3 != 10)) goto LAB_00102588;
                }
              }
              goto LAB_00102560;
            }
          }
        }
        lVar6 = 0;
      }
      else {
LAB_001024f2:
        lVar6 = 0;
      }
    }
LAB_00102560:
    curl_multi_remove_handle(lVar6,lVar5);
    curl_easy_cleanup(lVar5);
    curl_multi_cleanup(lVar6);
    curl_global_cleanup();
  }
  fclose(__stream);
LAB_00102588:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl = NULL;
  FILE *hd_src = NULL;
  int hd;
  struct_stat file_info;
  CURLM *m = NULL;
  int running;

  start_test_timing();

  if(!libtest_arg2) {
#ifdef LIB529
    /* test 529 */
    fprintf(stderr, "Usage: lib529 [url] [uploadfile]\n");
#else
    /* test 525 */
    fprintf(stderr, "Usage: lib525 [url] [uploadfile]\n");
#endif
    return TEST_ERR_USAGE;
  }

  hd_src = fopen(libtest_arg2, "rb");
  if(NULL == hd_src) {
    fprintf(stderr, "fopen failed with error: %d (%s)\n",
            errno, strerror(errno));
    fprintf(stderr, "Error opening file: (%s)\n", libtest_arg2);
    return TEST_ERR_FOPEN;
  }

  /* get the file size of the local file */
  hd = fstat(fileno(hd_src), &file_info);
  if(hd == -1) {
    /* can't open file, bail out */
    fprintf(stderr, "fstat() failed with error: %d (%s)\n",
            errno, strerror(errno));
    fprintf(stderr, "ERROR: cannot open file (%s)\n", libtest_arg2);
    fclose(hd_src);
    return TEST_ERR_FSTAT;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    fclose(hd_src);
    return res;
  }

  easy_init(curl);

  /* enable uploading */
  easy_setopt(curl, CURLOPT_UPLOAD, 1L);

  /* specify target */
  easy_setopt(curl, CURLOPT_URL, URL);

  /* go verbose */
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* use active FTP */
  easy_setopt(curl, CURLOPT_FTPPORT, "-");

  /* now specify which file to upload */
  easy_setopt(curl, CURLOPT_READDATA, hd_src);

  /* NOTE: if you want this code to work on Windows with libcurl as a DLL, you
     MUST also provide a read callback with CURLOPT_READFUNCTION. Failing to
     do so will give you a crash since a DLL may not use the variable's memory
     when passed in to it from an app like this. */

  /* Set the size of the file to upload (optional).  If you give a *_LARGE
     option you MUST make sure that the type of the passed-in argument is a
     curl_off_t. If you use CURLOPT_INFILESIZE (without _LARGE) you must
     make sure that to pass in a type 'long' argument. */
  easy_setopt(curl, CURLOPT_INFILESIZE_LARGE, (curl_off_t)file_info.st_size);

  multi_init(m);

  multi_add_handle(m, curl);

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

#ifdef LIB529
  /* test 529 */
  /* proper cleanup sequence - type PA */
  curl_multi_remove_handle(m, curl);
  curl_multi_cleanup(m);
  curl_easy_cleanup(curl);
  curl_global_cleanup();
#else
  /* test 525 */
  /* proper cleanup sequence - type PB */
  curl_multi_remove_handle(m, curl);
  curl_easy_cleanup(curl);
  curl_multi_cleanup(m);
  curl_global_cleanup();
#endif

  /* close the local file */
  fclose(hd_src);

  return res;
}